

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifsct(bifcxdef *bifctx,int argc)

{
  ushort uVar1;
  ushort uVar2;
  runsdef *prVar3;
  anon_union_8_4_1dda36f5_for_runsv aVar4;
  ushort *__src;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint16_t tmp;
  short *psVar8;
  ushort *puVar9;
  ulong __n;
  uint siz;
  runcxdef *ctx;
  uint uVar10;
  uint uVar11;
  uint l;
  uchar *p;
  runsdef stk2;
  runsdef stk1;
  runsdef val;
  uint local_88;
  uint local_84;
  short *local_80;
  ushort *local_78;
  ushort *local_70;
  runcxdef *local_68;
  runsdef local_60;
  runsdef local_50;
  runsdef local_40;
  
  ctx = bifctx->bifcxrun;
  prVar3 = ctx->runcxsp;
  ctx->runcxsp = prVar3 + -1;
  if (prVar3[-1].runstyp == '\a') {
    local_60.runsv = (anon_union_8_4_1dda36f5_for_runsv)prVar3[-1].runsv.runsvstr;
    uVar1 = *(ushort *)local_60.runsv.runsvstr;
    uVar10 = (uint)uVar1;
    ctx->runcxsp = prVar3 + -2;
    if (prVar3[-2].runstyp == '\a') {
      aVar4 = (anon_union_8_4_1dda36f5_for_runsv)prVar3[-2].runsv.runsvstr;
      uVar2 = *(ushort *)aVar4.runsvstr;
      local_50.runsv = aVar4;
      siz = (uint)uVar2;
      if (uVar1 <= uVar2) {
        local_50.runsv = local_60.runsv;
        local_60.runsv = aVar4;
        siz = (uint)uVar1;
        uVar10 = (uint)uVar2;
      }
      local_60.runstyp = '\a';
      local_50.runstyp = '\a';
      local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->runcxhp;
      if ((uint)(*(int *)&ctx->runcxhtop - (int)local_40.runsv.runsvnum) <= siz) {
        runhcmp(ctx,siz,2,&local_50,&local_60,(runsdef *)0x0);
        local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->runcxhp;
      }
      local_70 = (ushort *)(local_50.runsv.runsvnum + 2);
      local_84 = siz - 2;
      psVar8 = (short *)(local_40.runsv.runsvnum + 2);
      if (local_84 != 0) {
        puVar9 = (ushort *)(local_60.runsv.runsvnum + 2);
        uVar11 = uVar10 - 2;
        local_80 = (short *)(local_40.runsv.runsvnum + 2);
        local_68 = ctx;
        do {
          uVar5 = datsiz((uint)(byte)*local_70,(byte *)((long)local_70 + 1));
          local_88 = uVar11;
          local_78 = puVar9;
          if (uVar11 != 0) {
            __n = (ulong)(uVar5 + 1);
            do {
              uVar6 = datsiz((uint)(byte)*local_78,(byte *)((long)local_78 + 1));
              __src = local_78;
              if ((uVar5 == uVar6) &&
                 (iVar7 = bcmp(local_70,local_78,__n), psVar8 = local_80, iVar7 == 0)) {
                memcpy(local_80,__src,__n);
                local_80 = (short *)((long)psVar8 + __n);
                break;
              }
              lstadv((uchar **)&local_78,&local_88);
            } while (local_88 != 0);
          }
          lstadv((uchar **)&local_70,&local_84);
        } while (local_84 != 0);
        local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)local_68->runcxhp;
        psVar8 = local_80;
        ctx = local_68;
      }
      local_40.runstyp = '\a';
      *(objnum *)local_40.runsv.runsvstr = (short)psVar8 - local_40.runsv.runsvobj;
      ctx->runcxhp = (uchar *)psVar8;
      runrepush(ctx,&local_40);
      return;
    }
  }
  ctx->runcxerr->errcxptr->erraac = 0;
  runsign(ctx,0x3fc);
}

Assistant:

void bifsct(bifcxdef *bifctx, int argc)
{
    runcxdef *ctx = bifctx->bifcxrun;
    uchar    *l1;
    uchar    *l2;
    uchar    *l3;
    uint      siz1;
    uint      siz2;
    uint      siz3;
    uchar    *p;
    uint      l;
    uint      dsz1;
    uint      dsz2;
    runsdef   val;
    runsdef   stk1, stk2;
    
    bifcntargs(bifctx, 2, argc);
    l1 = runpoplst(ctx);
    siz1 = osrp2(l1);
    l2 = runpoplst(ctx);
    siz2 = osrp2(l2);

    /* make sure the first list is smaller - if not, switch them */
    if (siz1 > siz2)
        l3 = l1, l1 = l2, l2 = l3, siz3 = siz1, siz1 = siz2, siz2 = siz3;
    
    /* size of result is at most size of smaller list (which is now siz1) */
    stk1.runstyp = stk2.runstyp = DAT_LIST;
    stk1.runsv.runsvstr = l1;
    stk2.runsv.runsvstr = l2;
    runhres2(ctx, siz1, 2, &stk1, &stk2);
    l1 = stk1.runsv.runsvstr;
    l2 = stk2.runsv.runsvstr;
    l3 = ctx->runcxhp + 2;

    /* go through list1, and copy each element that is found in list2 */
    for (l1 += 2, l2 += 2, siz1 -= 2, siz2 -= 2 ; siz1 ; lstadv(&l1, &siz1))
    {
        dsz1 = datsiz(*l1, l1 + 1) + 1;
        for (l = siz2, p = l2 ; l ; lstadv(&p, &l))
        {
            dsz2 = datsiz(*p, p + 1) + 1;
#ifndef AMIGA
            if (dsz1 == dsz2 && !memcmp(l1, p, (size_t)dsz1))
#else /* AMIGA */
            if (!memcmp(l1, p, (size_t)dsz1) && (dsz1 == dsz2) )
#endif /* AMIGA */
            {
                memcpy(l3, p, (size_t)dsz1);
                l3 += dsz1;
                break;
            }
        }
    }
    
    /* set up return value, take it out of the heap, and push value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_LIST;
    oswp2(ctx->runcxhp, (uint)(l3 - ctx->runcxhp));
    ctx->runcxhp = l3;
    runrepush(ctx, &val);
}